

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O2

_Bool export_ssh2(Filename *filename,int type,ssh2_userkey *key,char *passphrase)

{
  BinarySink *pBVar1;
  BinarySink *bs;
  uint uVar2;
  ssh_keyalg *psVar3;
  ptrlen *ppVar4;
  ptrlen *ppVar5;
  ptrlen *ppVar6;
  ptrlen *ppVar7;
  ptrlen *ppVar8;
  _Bool _Var9;
  uint uVar11;
  ssh_key *psVar12;
  strbuf *psVar13;
  strbuf *psVar14;
  strbuf *psVar15;
  uchar *data;
  strbuf *psVar16;
  strbuf *psVar17;
  size_t sVar18;
  uint8_t uVar10;
  mp_int *n;
  mp_int *r;
  mp_int *r_00;
  mp_int *x;
  mp_int *x_00;
  size_t sVar19;
  ulong byte;
  ptrlen *ppVar20;
  FILE *pFVar21;
  int iVar22;
  size_t *psVar23;
  int len;
  uint uVar24;
  char *pcVar25;
  ulong uVar26;
  ptrlen *ppVar27;
  ptrlen *ppVar28;
  ptrlen *ppVar29;
  uint8_t *puVar30;
  ulong uVar31;
  long lVar32;
  bool bVar33;
  ptrlen pVar34;
  ptrlen pVar35;
  ptrlen pVar36;
  ptrlen pVar37;
  ptrlen pVar38;
  ptrlen pVar39;
  ptrlen pVar40;
  ptrlen pVar41;
  ptrlen pVar42;
  char zero [1];
  uint8_t *local_1b0;
  char *local_1a8;
  char *local_1a0;
  size_t local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  size_t local_170;
  size_t local_168;
  void *local_160;
  ptrlen *local_150;
  size_t *local_148;
  size_t local_140;
  void *local_128;
  uchar iv [8];
  char *local_118;
  size_t local_110;
  ptrlen local_108;
  ptrlen local_f8;
  ptrlen local_e8;
  ptrlen local_d8;
  ptrlen local_c8;
  ptrlen local_b8;
  ptrlen local_a8;
  ptrlen local_98;
  void *local_88;
  size_t local_80;
  uint8_t padding_buf [8];
  BinarySource src [1];
  
  if (type == 7) {
    psVar13 = strbuf_new();
    (*key->key->vt->public_blob)(key->key,psVar13->binarysink_);
    psVar14 = strbuf_new_nm();
    (*key->key->vt->private_blob)(key->key,psVar14->binarysink_);
    psVar3 = key->key->vt;
    if (psVar3 == &ssh_rsa) {
      src[0].data = psVar13->u;
      src[0].len = psVar13->len;
      src[0].pos = 0;
      src[0].err = BSE_NO_ERROR;
      src[0].binarysource_ = src;
      BinarySource_get_string(src);
      pVar36 = BinarySource_get_string(src[0].binarysource_);
      pVar42 = BinarySource_get_string(src[0].binarysource_);
      src[0].data = psVar14->u;
      src[0].len = psVar14->len;
      src[0].pos = 0;
      src[0].err = BSE_NO_ERROR;
      src[0].binarysource_ = src;
      pVar37 = BinarySource_get_string(src);
      pVar38 = BinarySource_get_string(src[0].binarysource_);
      pVar41 = BinarySource_get_string(src[0].binarysource_);
      pVar35 = BinarySource_get_string(src[0].binarysource_);
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        __assert_fail("!get_err(src)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x899,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
      }
      ppVar20 = &local_f8;
      ppVar27 = &local_e8;
      ppVar28 = &local_d8;
      ppVar29 = &local_c8;
      psVar23 = &local_108.len;
      ppVar4 = &local_f8;
      ppVar5 = &local_e8;
      ppVar7 = &local_d8;
      ppVar6 = &local_c8;
      pVar34.len = pVar37.len;
      pVar34.ptr = pVar36.ptr;
      iVar22 = 6;
      pcVar25 = "if-modn{sign{rsa-pkcs1-sha1},encrypt{rsa-pkcs1v2-oaep}}";
      local_110 = pVar36.len;
      local_108.ptr = pVar37.ptr;
    }
    else {
      bVar33 = false;
      if (psVar3 != &ssh_dsa) goto LAB_00115170;
      src[0].data = psVar13->u;
      src[0].len = psVar13->len;
      src[0].pos = 0;
      src[0].err = BSE_NO_ERROR;
      src[0].binarysource_ = src;
      BinarySource_get_string(src);
      pVar34 = BinarySource_get_string(src[0].binarysource_);
      pVar35 = BinarySource_get_string(src[0].binarysource_);
      pVar42 = BinarySource_get_string(src[0].binarysource_);
      pVar41 = BinarySource_get_string(src[0].binarysource_);
      src[0].data = psVar14->u;
      src[0].len = psVar14->len;
      src[0].pos = 0;
      src[0].err = BSE_NO_ERROR;
      src[0].binarysource_ = src;
      pVar38 = BinarySource_get_string(src);
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        __assert_fail("!get_err(src)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x8b5,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
      }
      psVar23 = &local_110;
      ppVar20 = &local_108;
      iVar22 = 5;
      pcVar25 = "dl-modp{sign{dsa-nist-sha1},dh{plain}}";
      ppVar4 = &local_108;
      ppVar5 = &local_f8;
      ppVar7 = &local_e8;
      ppVar27 = &local_f8;
      ppVar28 = &local_e8;
      ppVar6 = &local_d8;
      ppVar29 = &local_d8;
    }
    local_190 = pVar41.len;
    local_1a0 = (char *)pVar41.ptr;
    local_1a8 = (char *)pVar35.len;
    local_180 = pVar35.ptr;
    local_170 = pVar38.len;
    local_188 = pVar38.ptr;
    local_168 = pVar42.len;
    local_160 = pVar42.ptr;
    local_1b0 = (uint8_t *)pVar34.len;
    local_118 = (char *)pVar34.ptr;
    *psVar23 = (size_t)local_1b0;
    ppVar20->ptr = local_160;
    ppVar4->len = local_168;
    ppVar27->ptr = local_180;
    ppVar5->len = (size_t)local_1a8;
    ppVar28->ptr = local_1a0;
    ppVar7->len = local_190;
    ppVar29->ptr = local_188;
    ppVar6->len = local_170;
    psVar15 = strbuf_new_nm();
    pBVar1 = psVar15->binarysink_;
    BinarySink_put_uint32(pBVar1,0x3f6ff9eb);
    BinarySink_put_uint32(pBVar1,0);
    BinarySink_put_stringz(pBVar1,pcVar25);
    pcVar25 = "3des-cbc";
    if (passphrase == (char *)0x0) {
      pcVar25 = "none";
    }
    BinarySink_put_stringz(pBVar1,pcVar25);
    sVar19 = psVar15->len;
    BinarySink_put_uint32(pBVar1,0);
    BinarySink_put_uint32(pBVar1,0);
    if (psVar3 != &ssh_rsa) {
      BinarySink_put_uint32(pBVar1,0);
    }
    for (uVar31 = 0; (uint)(iVar22 << 4) != uVar31; uVar31 = uVar31 + 0x10) {
      pVar42.len = *(size_t *)((long)&local_110 + uVar31);
      pVar42.ptr = *(void **)((long)&local_118 + uVar31);
      BinarySink_put_mp_sshcom_from_string(pBVar1,pVar42);
    }
    uVar24 = (uint)sVar19;
    uVar11 = ((int)psVar15->len - uVar24) - 8;
    *(uint *)(psVar15->s + (long)(int)uVar24 + 4) =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 * 0x1000000;
    if (passphrase != (char *)0x0) {
      uVar31 = (ulong)((uVar24 ^ 4) - (int)psVar15->len & 7);
      random_read(padding_buf,uVar31);
      BinarySink_put_data(pBVar1,padding_buf,uVar31);
    }
    pcVar25 = psVar15->s;
    uVar11 = ((int)psVar15->len - uVar24) - 4;
    if ((passphrase != (char *)0x0) && ((uVar11 & 7) != 0)) {
      __assert_fail("!passphrase || cipherlen % 8 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x8e0,"_Bool sshcom_write(const Filename *, ssh2_userkey *, const char *)");
    }
    *(uint *)(pcVar25 + (int)uVar24) =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 * 0x1000000;
    uVar2 = (uint)psVar15->len;
    *(uint *)(psVar15->s + 4) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (passphrase != (char *)0x0) {
      pVar42 = ptrlen_from_asciz(passphrase);
      sshcom_derivekey(pVar42,padding_buf);
      iv[0] = '\0';
      iv[1] = '\0';
      iv[2] = '\0';
      iv[3] = '\0';
      iv[4] = '\0';
      iv[5] = '\0';
      iv[6] = '\0';
      iv[7] = '\0';
      des3_encrypt_pubkey_ossh(padding_buf,iv,pcVar25 + (long)(int)uVar24 + 4,uVar11);
      smemclr(padding_buf,0x20);
    }
    pFVar21 = (FILE *)f_open(filename,"wb",true);
    bVar33 = pFVar21 != (FILE *)0x0;
    if (bVar33) {
      fputs("---- BEGIN SSH2 ENCRYPTED PRIVATE KEY ----\n",pFVar21);
      fwrite("Comment: \"",10,1,pFVar21);
      pcVar25 = key->comment;
      uVar11 = 0x3c;
      while (sVar18 = strlen(pcVar25), (int)uVar11 < (int)sVar18) {
        fprintf(pFVar21,"%.*s\\\n",(ulong)uVar11,pcVar25);
        pcVar25 = pcVar25 + uVar11;
        uVar11 = 0x46;
      }
      fprintf(pFVar21,"%s\"\n",pcVar25);
      pVar38.ptr = psVar15->u;
      pVar38.len = psVar15->len;
      base64_encode_fp((FILE *)pFVar21,pVar38,0x46);
      fputs("---- END SSH2 ENCRYPTED PRIVATE KEY ----\n",pFVar21);
      fclose(pFVar21);
    }
    strbuf_free(psVar15);
LAB_00115170:
    if (psVar14 != (strbuf *)0x0) {
      strbuf_free(psVar14);
    }
    if (psVar13 == (strbuf *)0x0) {
      return bVar33;
    }
    strbuf_free(psVar13);
    return bVar33;
  }
  if (type == 6) {
LAB_001149a9:
    _Var9 = openssh_new_write(filename,key,passphrase);
    return _Var9;
  }
  if (type != 4) {
    return false;
  }
  psVar12 = (*key->key->vt->base_key)(key->key);
  psVar3 = psVar12->vt;
  if ((((psVar3 != &ssh_ecdsa_nistp521) && (psVar3 != &ssh_ecdsa_nistp384)) &&
      (psVar3 != &ssh_ecdsa_nistp256)) && ((psVar3 != &ssh_dsa && (psVar3 != &ssh_rsa))))
  goto LAB_001149a9;
  psVar12 = (*key->key->vt->base_key)(key->key);
  psVar13 = strbuf_new();
  (*psVar12->vt->public_blob)(psVar12,psVar13->binarysink_);
  psVar14 = strbuf_new_nm();
  (*psVar12->vt->private_blob)(psVar12,psVar14->binarysink_);
  psVar15 = strbuf_new_nm();
  psVar3 = psVar12->vt;
  if (psVar3 == &ssh_rsa) {
    src[0].data = psVar13->u;
    src[0].len = psVar13->len;
    src[0].pos = 0;
    src[0].err = BSE_NO_ERROR;
    src[0].binarysource_ = src;
    BinarySource_get_string(src);
    pVar41 = BinarySource_get_string(src[0].binarysource_);
    pVar35 = BinarySource_get_string(src[0].binarysource_);
    src[0].data = psVar14->u;
    src[0].len = psVar14->len;
    src[0].pos = 0;
    src[0].err = BSE_NO_ERROR;
    src[0].binarysource_ = src;
    pVar36 = BinarySource_get_string(src);
    pVar42 = BinarySource_get_string(src[0].binarysource_);
    pVar38 = BinarySource_get_string(src[0].binarysource_);
    pVar37 = BinarySource_get_string(src[0].binarysource_);
    local_80 = pVar37.len;
    if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
      __assert_fail("!get_err(src)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x36c,"_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)")
      ;
    }
    local_88 = pVar36.ptr;
    n = mp_from_bytes_be(pVar36);
    r = mp_from_bytes_be(pVar42);
    r_00 = mp_from_bytes_be(pVar38);
    mp_sub_integer_into(r,r,1);
    mp_sub_integer_into(r_00,r_00,1);
    x = mp_mod(n,r);
    x_00 = mp_mod(n,r_00);
    mp_free(n);
    mp_free(r);
    mp_free(r_00);
    sVar19 = mp_get_nbits(x);
    uVar26 = sVar19 + 8 >> 3;
    sVar19 = mp_get_nbits(x_00);
    byte = sVar19 + 8 >> 3;
    local_180 = (void *)(long)((int)byte + (int)uVar26);
    local_1b0 = (uint8_t *)safemalloc((size_t)local_180,1,0);
    pVar39.len = uVar26;
    pVar39.ptr = local_1b0;
    puVar30 = local_1b0;
    uVar31 = uVar26;
    while (uVar31 = uVar31 - 1, uVar31 != 0xffffffffffffffff) {
      uVar10 = mp_get_byte(x,uVar31);
      *puVar30 = uVar10;
      puVar30 = puVar30 + 1;
    }
    puVar30 = local_1b0 + uVar26;
    pVar40.len = byte;
    pVar40.ptr = puVar30;
    while( true ) {
      local_188 = pVar42.ptr;
      byte = byte - 1;
      if (byte == 0xffffffffffffffff) break;
      uVar10 = mp_get_byte(x_00,byte);
      *puVar30 = uVar10;
      puVar30 = puVar30 + 1;
    }
    mp_free(x);
    mp_free(x_00);
    local_1a8 = (char *)pVar41.ptr;
    local_f8.ptr = local_1a8;
    local_1a0 = (char *)pVar41.len;
    local_f8.len = (size_t)local_1a0;
    local_e8.ptr = local_88;
    iVar22 = 9;
    local_1a8 = "-----END RSA PRIVATE KEY-----\n";
    local_1a0 = "-----BEGIN RSA PRIVATE KEY-----\n";
    ppVar20 = &local_d8;
    ppVar4 = &local_d8;
    local_150 = &local_c8;
    ppVar5 = &local_c8;
    pVar41.len = local_80;
    pVar41.ptr = pVar37.ptr;
    ppVar27 = &local_b8;
    ppVar7 = &local_b8;
    ppVar28 = &local_a8;
    ppVar6 = &local_a8;
    ppVar29 = &local_98;
    ppVar8 = &local_98;
    local_e8.len = pVar36.len;
LAB_00115601:
    local_148 = &ppVar4->len;
    local_118 = zero;
    local_190 = pVar40.len;
    local_128 = pVar40.ptr;
    local_140 = pVar38.len;
    local_178 = pVar38.ptr;
    local_170 = pVar42.len;
    local_110 = 1;
    zero[0] = '\0';
    local_108 = pVar35;
    ppVar20->ptr = local_188;
    *local_148 = local_170;
    local_150->ptr = local_178;
    ppVar5->len = local_140;
    ppVar27->ptr = pVar39.ptr;
    ppVar7->len = pVar39.len;
    ppVar28->ptr = local_128;
    ppVar6->len = local_190;
    ppVar29->ptr = pVar41.ptr;
    ppVar8->len = pVar41.len;
    psVar16 = strbuf_new_nm();
    for (uVar31 = 0; (uint)(iVar22 << 4) != uVar31; uVar31 = uVar31 + 0x10) {
      sVar19 = *(size_t *)((long)&local_110 + uVar31);
      BinarySink_put_ber_id_len(psVar16->binarysink_,2,(int)sVar19,0);
      pVar36.len = sVar19;
      pVar36.ptr = *(void **)((long)&local_118 + uVar31);
      BinarySink_put_datapl(psVar16->binarysink_,pVar36);
    }
    BinarySink_put_ber_id_len(psVar15->binarysink_,0x10,(int)psVar16->len,0x20);
    BinarySink_put_data(psVar15->binarysink_,psVar16->s,psVar16->len);
    strbuf_free(psVar16);
  }
  else {
    if (psVar3 == &ssh_dsa) {
      src[0].data = psVar13->u;
      src[0].len = psVar13->len;
      src[0].pos = 0;
      src[0].err = BSE_NO_ERROR;
      src[0].binarysource_ = src;
      BinarySource_get_string(src);
      pVar42 = BinarySource_get_string(src[0].binarysource_);
      local_188 = pVar42.ptr;
      pVar38 = BinarySource_get_string(src[0].binarysource_);
      pVar39 = BinarySource_get_string(src[0].binarysource_);
      pVar40 = BinarySource_get_string(src[0].binarysource_);
      src[0].data = psVar14->u;
      src[0].len = psVar14->len;
      src[0].pos = 0;
      src[0].err = BSE_NO_ERROR;
      src[0].binarysource_ = src;
      pVar41 = BinarySource_get_string(src);
      pVar35.len = local_108.len;
      pVar35.ptr = local_108.ptr;
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        __assert_fail("!get_err(src)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                      0x3a4,
                      "_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)");
      }
      ppVar20 = &local_108;
      ppVar4 = &local_108;
      local_150 = &local_f8;
      ppVar5 = &local_f8;
      ppVar27 = &local_e8;
      ppVar7 = &local_e8;
      iVar22 = 6;
      local_1a8 = "-----END DSA PRIVATE KEY-----\n";
      local_1a0 = "-----BEGIN DSA PRIVATE KEY-----\n";
      local_180 = (void *)0x0;
      ppVar28 = &local_d8;
      ppVar6 = &local_d8;
      ppVar29 = &local_c8;
      ppVar8 = &local_c8;
      local_1b0 = (uint8_t *)0x0;
      goto LAB_00115601;
    }
    if (((psVar3 != &ssh_ecdsa_nistp521) && (psVar3 != &ssh_ecdsa_nistp256)) &&
       (psVar3 != &ssh_ecdsa_nistp384)) {
      __assert_fail("false && \"bad key alg in openssh_pem_write\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/import.c",
                    0x3f9,"_Bool openssh_pem_write(const Filename *, ssh2_userkey *, const char *)")
      ;
    }
    data = ec_alg_oid(psVar3,(int *)src);
    uVar11 = (uint)((ulong)((psVar12[-3].vt)->freekey + 7) >> 2);
    psVar16 = strbuf_new_nm();
    pBVar1 = psVar16->binarysink_;
    local_180 = (void *)0x0;
    BinarySink_put_ber_id_len(pBVar1,2,1,0);
    BinarySink_put_byte(pBVar1,'\x01');
    BinarySink_put_ber_id_len(pBVar1,4,(int)psVar14->len + -4,0);
    BinarySink_put_data(pBVar1,psVar14->s + 4,psVar14->len - 4);
    psVar17 = strbuf_new();
    BinarySink_put_ber_id_len(psVar17->binarysink_,6,(int)src[0].data,0);
    BinarySink_put_data(psVar17->binarysink_,data,(long)(int)src[0].data);
    BinarySink_put_ber_id_len(pBVar1,0,(int)psVar17->len,0xa0);
    BinarySink_put_data(pBVar1,psVar17->s,psVar17->len);
    strbuf_free(psVar17);
    psVar17 = strbuf_new();
    bs = psVar17->binarysink_;
    BinarySink_put_ber_id_len(bs,3,(uVar11 & 0xfffffffe) + 2,0);
    BinarySink_put_byte(bs,'\0');
    BinarySink_put_data(bs,psVar13->s + 0x27,(long)(int)uVar11 | 1);
    BinarySink_put_ber_id_len(pBVar1,1,(int)psVar17->len,0xa0);
    BinarySink_put_data(pBVar1,psVar17->s,psVar17->len);
    strbuf_free(psVar17);
    BinarySink_put_ber_id_len(psVar15->binarysink_,0x10,(int)psVar16->len,0x20);
    BinarySink_put_data(psVar15->binarysink_,psVar16->s,psVar16->len);
    strbuf_free(psVar16);
    local_1a8 = "-----END EC PRIVATE KEY-----\n";
    local_1a0 = "-----BEGIN EC PRIVATE KEY-----\n";
    local_1b0 = (uint8_t *)0x0;
  }
  if (passphrase != (char *)0x0) {
    uVar11 = (uint)psVar15->len;
    len = (uVar11 & 0xfffffff8) + 8;
    iVar22 = len - uVar11;
    BinarySink_put_padding(psVar15->binarysink_,(long)iVar22,(uchar)iVar22);
    random_read(iv,8);
    pVar42 = ptrlen_from_asciz(passphrase);
    openssh_pem_derivekey(pVar42,iv,padding_buf);
    des3_encrypt_pubkey_ossh(padding_buf,iv,psVar15->u,len);
    smemclr(padding_buf,0x20);
  }
  pFVar21 = (FILE *)f_open(filename,"wb",true);
  if (pFVar21 == (FILE *)0x0) {
    if (psVar15 == (strbuf *)0x0) goto LAB_00115806;
  }
  else {
    fputs(local_1a0,pFVar21);
    if (passphrase != (char *)0x0) {
      fwrite("Proc-Type: 4,ENCRYPTED\nDEK-Info: DES-EDE3-CBC,",0x2e,1,pFVar21);
      for (lVar32 = 0; lVar32 != 8; lVar32 = lVar32 + 1) {
        fprintf(pFVar21,"%02X",(ulong)iv[lVar32]);
      }
      fwrite("\n\n",2,1,pFVar21);
    }
    pVar37.ptr = psVar15->u;
    pVar37.len = psVar15->len;
    base64_encode_fp((FILE *)pFVar21,pVar37,0x40);
    fputs(local_1a8,pFVar21);
    fclose(pFVar21);
  }
  strbuf_free(psVar15);
LAB_00115806:
  if (local_1b0 != (uint8_t *)0x0) {
    smemclr(local_1b0,(size_t)local_180);
    safefree(local_1b0);
  }
  if (psVar14 != (strbuf *)0x0) {
    strbuf_free(psVar14);
  }
  if (psVar13 != (strbuf *)0x0) {
    strbuf_free(psVar13);
  }
  return pFVar21 != (FILE *)0x0;
}

Assistant:

bool export_ssh2(const Filename *filename, int type,
                 ssh2_userkey *key, char *passphrase)
{
    if (type == SSH_KEYTYPE_OPENSSH_AUTO)
        return openssh_auto_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_OPENSSH_NEW)
        return openssh_new_write(filename, key, passphrase);
    if (type == SSH_KEYTYPE_SSHCOM)
        return sshcom_write(filename, key, passphrase);
    return false;
}